

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O1

ON_Brep * __thiscall ON_Brep::SubBrep(ON_Brep *this,int subfi_count,int *subfi,ON_Brep *sub_brep)

{
  ON_Object *src;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ON_BrepVertex *pOVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ON_3dPoint vertex_point;
  unsigned_short uVar22;
  unsigned_short uVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  int *__s;
  int *__s_00;
  ulong new_capacity;
  long lVar27;
  ON_BrepLoop *pOVar28;
  ON_Brep *pOVar29;
  ON_BrepTrim *pOVar30;
  ON_BrepEdge *pOVar31;
  ON_BrepVertex *this_00;
  undefined4 extraout_var;
  ON_BrepEdge *this_01;
  undefined4 extraout_var_00;
  ON_BrepFace *pOVar32;
  ON_BrepLoop *loop;
  undefined4 extraout_var_01;
  ON_BrepTrim *pOVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ON_BrepFace *pOVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  ON_Curve *c2;
  ON_BoundingBox sub_bbox;
  ON_Surface *srf;
  ON_Brep *local_130;
  int local_124;
  uint local_114;
  char *local_d0;
  ON_Curve *local_b8;
  LeakStopper local_b0;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  ON_Workspace::ON_Workspace(&local_b0.super_ON_Workspace);
  local_b0.m_p = (ON_Brep *)0x0;
  local_b0.m_sub_brep = (ON_Brep *)0x0;
  if (sub_brep != (ON_Brep *)0x0) {
    Destroy(sub_brep);
  }
  if ((subfi == (int *)0x0 || subfi_count < 1) ||
     (iVar26 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
               m_count, iVar26 < subfi_count)) {
LAB_00410ea6:
    local_130 = (ON_Brep *)0x0;
  }
  else {
    __s = ON_Workspace::GetIntMemory
                    (&local_b0.super_ON_Workspace,
                     (long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                           super_ON_ClassArray<ON_BrepEdge>.m_count);
    uVar2 = 0;
    memset(__s,0,(long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                       super_ON_ClassArray<ON_BrepEdge>.m_count << 2);
    __s_00 = ON_Workspace::GetIntMemory
                       (&local_b0.super_ON_Workspace,
                        (long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                              super_ON_ClassArray<ON_BrepVertex>.m_count);
    memset(__s_00,0,(long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                          super_ON_ClassArray<ON_BrepVertex>.m_count << 2);
    new_capacity = (ulong)(uint)subfi_count;
    local_114 = 0;
    uVar1 = 0;
    uVar36 = 0;
    if (0 < subfi_count) {
      local_124 = -1;
      local_d0 = "ON_Brep::SubBrep sub_fi[] has duplicate indices";
      uVar38 = 0;
      uVar36 = 0;
      uVar1 = 0;
      local_114 = 0;
      uVar2 = 0;
      do {
        iVar39 = subfi[uVar38];
        lVar27 = (long)iVar39;
        iVar40 = 0x443;
        if ((lVar27 < 0) ||
           ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count
            <= iVar39)) {
          local_d0 = "ON_Brep::SubBrep sub_fi[] has invalid indices";
LAB_0041194d:
          local_130 = (ON_Brep *)0x0;
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_region.cpp"
                     ,iVar40,"",local_d0);
          goto LAB_00410ea8;
        }
        iVar40 = iVar39;
        iVar3 = iVar26;
        if (((iVar39 <= local_124) && (iVar40 = local_124, iVar3 = iVar39, iVar26 <= iVar39)) &&
           (iVar3 = iVar26, uVar38 != 0)) {
          uVar35 = 0;
          do {
            if (subfi[uVar35] == iVar39) {
              iVar40 = 0x450;
              goto LAB_0041194d;
            }
            uVar35 = uVar35 + 1;
          } while (uVar38 != uVar35);
        }
        iVar26 = iVar3;
        local_124 = iVar40;
        pOVar37 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
        ;
        iVar39 = pOVar37[lVar27].m_li.m_count;
        bVar24 = 0 < iVar39;
        if (0 < iVar39) {
          pOVar37 = pOVar37 + lVar27;
          iVar39 = 0;
          do {
            pOVar28 = ON_BrepFace::Loop(pOVar37,iVar39);
            if ((pOVar28 == (ON_BrepLoop *)0x0) ||
               (pOVar29 = ON_BrepLoop::Brep(pOVar28), pOVar29 != this)) {
              bVar25 = false;
            }
            else {
              uVar36 = uVar36 + 1;
              if ((pOVar28->m_ti).m_count < 1) {
                bVar25 = true;
              }
              else {
                iVar40 = 0;
                do {
                  pOVar30 = ON_BrepLoop::Trim(pOVar28,iVar40);
                  if ((pOVar30 == (ON_BrepTrim *)0x0) ||
                     (pOVar29 = ON_BrepTrim::Brep(pOVar30), pOVar29 != this)) {
LAB_00411099:
                    bVar25 = false;
                  }
                  else {
                    uVar1 = uVar1 + 1;
                    lVar27 = (long)pOVar30->m_vi[0];
                    if ((lVar27 < 0) ||
                       ((iVar3 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                                 super_ON_ClassArray<ON_BrepVertex>.m_count,
                        iVar3 <= pOVar30->m_vi[0] ||
                        (iVar3 <= pOVar30->m_vi[1] || pOVar30->m_vi[1] < 0)))) goto LAB_00411099;
                    if (__s_00[lVar27] == 0) {
                      __s_00[lVar27] = 1;
                      uVar2 = uVar2 + 1;
                    }
                    if (__s_00[pOVar30->m_vi[1]] == 0) {
                      __s_00[pOVar30->m_vi[1]] = 1;
                      uVar2 = uVar2 + 1;
                    }
                    if ((pOVar30->m_type | mated) != ptonsrf) {
                      if (-1 < pOVar30->m_ei) {
                        pOVar31 = ON_BrepTrim::Edge(pOVar30);
                        if ((pOVar31 == (ON_BrepEdge *)0x0) ||
                           (pOVar29 = ON_BrepEdge::Brep(pOVar31), pOVar29 != this)) {
LAB_00411162:
                          bVar25 = false;
                        }
                        else {
                          bVar25 = true;
                          if (__s[pOVar30->m_ei] == 0) {
                            __s[pOVar30->m_ei] = 1;
                            local_114 = local_114 + 1;
                            if (__s_00[pOVar31->m_vi[0]] == 0) goto LAB_00411162;
                            bVar25 = __s_00[pOVar31->m_vi[1]] != 0;
                          }
                        }
                        if (bVar25) goto LAB_0041116c;
                      }
                      goto LAB_00411099;
                    }
                    if ((-1 < pOVar30->m_ei) || (pOVar30->m_vi[0] != pOVar30->m_vi[1]))
                    goto LAB_00411099;
LAB_0041116c:
                    bVar25 = true;
                  }
                } while ((bVar25) && (iVar40 = iVar40 + 1, iVar40 < (pOVar28->m_ti).m_count));
              }
            }
            if (!bVar25) break;
            iVar39 = iVar39 + 1;
            iVar40 = (pOVar37->m_li).m_count;
            bVar24 = iVar39 < iVar40;
          } while (iVar39 < iVar40);
        }
        if (bVar24) goto LAB_00410ea6;
        uVar38 = uVar38 + 1;
      } while (uVar38 != new_capacity);
    }
    local_130 = sub_brep;
    pOVar29 = sub_brep;
    if (sub_brep == (ON_Brep *)0x0) {
      local_130 = New();
      local_b0.m_p = local_130;
      pOVar29 = local_b0.m_sub_brep;
    }
    local_b0.m_sub_brep = pOVar29;
    if ((uint)(local_130->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
              m_capacity < (uint)subfi_count) {
      ON_ClassArray<ON_BrepFace>::SetCapacity
                ((ON_ClassArray<ON_BrepFace> *)&local_130->m_F,new_capacity);
    }
    if ((uint)(local_130->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
              m_capacity < uVar36) {
      ON_ClassArray<ON_BrepLoop>::SetCapacity
                ((ON_ClassArray<ON_BrepLoop> *)&local_130->m_L,(long)(int)uVar36);
    }
    if ((uint)(local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
              m_capacity < uVar1) {
      ON_ClassArray<ON_BrepTrim>::SetCapacity
                ((ON_ClassArray<ON_BrepTrim> *)&local_130->m_T,(long)(int)uVar1);
    }
    if ((uint)(local_130->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              m_capacity < local_114) {
      ON_ClassArray<ON_BrepEdge>::SetCapacity
                ((ON_ClassArray<ON_BrepEdge> *)&local_130->m_E,(long)(int)local_114);
    }
    if ((uint)(local_130->m_V).super_ON_ObjectArray<ON_BrepVertex>.
              super_ON_ClassArray<ON_BrepVertex>.m_capacity < uVar2) {
      ON_ClassArray<ON_BrepVertex>::SetCapacity
                ((ON_ClassArray<ON_BrepVertex> *)&local_130->m_V,(long)(int)uVar2);
    }
    if ((uint)(local_130->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < (uint)subfi_count) {
      ON_SimpleArray<ON_Surface_*>::SetCapacity
                (&(local_130->m_S).super_ON_SimpleArray<ON_Surface_*>,new_capacity);
    }
    if ((uint)(local_130->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < uVar1) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(local_130->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)(int)uVar1);
    }
    if ((uint)(local_130->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_114) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(local_130->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_114);
    }
    if (0 < (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
            m_count) {
      lVar41 = 0;
      lVar27 = 0;
      do {
        if (__s_00[lVar27] == 0) {
          __s_00[lVar27] = -1;
        }
        else {
          pOVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                   super_ON_ClassArray<ON_BrepVertex>.m_a;
          vertex_point.z = *(double *)((long)&(pOVar4->super_ON_Point).point.z + lVar41);
          vertex_point._0_16_ =
               *(undefined1 (*) [16])((long)&(pOVar4->super_ON_Point).point.x + lVar41);
          this_00 = NewVertex(local_130,vertex_point,
                              *(double *)((long)&pOVar4->m_tolerance + lVar41));
          __s_00[lVar27] = this_00->m_vertex_index;
          ON_Object::CopyUserData
                    ((ON_Object *)this_00,
                     (ON_Object *)
                     ((long)&(pOVar4->super_ON_Point).super_ON_Geometry.super_ON_Object.
                             _vptr_ON_Object + lVar41));
          this_00->m_vertex_user = *(ON_U *)((long)&pOVar4->m_vertex_user + lVar41);
        }
        lVar27 = lVar27 + 1;
        lVar41 = lVar41 + 0x58;
      } while (lVar27 < (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                        super_ON_ClassArray<ON_BrepVertex>.m_count);
    }
    if (0 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count)
    {
      lVar41 = 0;
      lVar27 = 0;
      do {
        if (__s[lVar27] == 0) {
          __s[lVar27] = -1;
        }
        else {
          pOVar31 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                    m_a;
          if ((__s_00[*(int *)((long)pOVar31->m_vi + lVar41)] < 0) ||
             (__s_00[*(int *)((long)pOVar31->m_vi + lVar41 + 4)] < 0)) goto LAB_00410ea6;
          src = (ON_Object *)
                ((long)&(((ON_CurveProxy *)
                         (&(pOVar31->super_ON_CurveProxy).m_real_curve_domain + -2))->super_ON_Curve
                        ).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar41);
          iVar26 = (*src->_vptr_ON_Object[0x24])(src);
          local_90.m_min.x = (double)CONCAT44(extraout_var,iVar26);
          if (local_90.m_min.x == 0.0) goto LAB_00410ea6;
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(local_130->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_90);
          pOVar4 = (local_130->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                   super_ON_ClassArray<ON_BrepVertex>.m_a;
          this_01 = NewEdge(local_130,pOVar4 + __s_00[*(int *)((long)pOVar31->m_vi + lVar41)],
                            pOVar4 + __s_00[*(int *)((long)pOVar31->m_vi + lVar41 + 4)],
                            (local_130->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count + -1,
                            (ON_Interval *)0x0,*(double *)((long)pOVar31->m_vi + lVar41 + 0x24));
          __s[lVar27] = this_01->m_edge_index;
          ON_Object::CopyUserData((ON_Object *)this_01,src);
          this_01->m_edge_user = *(ON_U *)((long)pOVar31->m_vi + lVar41 + -0x14);
        }
        lVar27 = lVar27 + 1;
        lVar41 = lVar41 + 0x88;
      } while (lVar27 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                        super_ON_ClassArray<ON_BrepEdge>.m_count);
    }
    bVar24 = ON_BoundingBox::IsValid(&this->m_bbox);
    ON_BoundingBox::ON_BoundingBox(&local_90);
    if (0 < subfi_count) {
      uVar38 = 0;
      do {
        pOVar32 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
        ;
        pOVar37 = pOVar32 + subfi[uVar38];
        iVar26 = (*pOVar32[subfi[uVar38]].super_ON_SurfaceProxy.super_ON_Surface.super_ON_Geometry.
                   super_ON_Object._vptr_ON_Object[0x24])(pOVar37);
        local_60.m_min.x = (double)CONCAT44(extraout_var_00,iVar26);
        if (local_60.m_min.x == 0.0) {
LAB_004118b3:
          bVar25 = false;
        }
        else {
          ON_SimpleArray<ON_Surface_*>::Append
                    (&(local_130->m_S).super_ON_SimpleArray<ON_Surface_*>,(ON_Surface **)&local_60);
          pOVar32 = NewFace(local_130,
                            (local_130->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count + -1);
          ON_Object::CopyUserData((ON_Object *)pOVar32,(ON_Object *)pOVar37);
          pOVar32->m_bRev = pOVar37->m_bRev;
          pOVar32->m_face_material_channel = pOVar37->m_face_material_channel;
          uVar22 = (pOVar37->m_face_uuid).Data2;
          uVar23 = (pOVar37->m_face_uuid).Data3;
          uVar16 = *(undefined8 *)(pOVar37->m_face_uuid).Data4;
          (pOVar32->m_face_uuid).Data1 = (pOVar37->m_face_uuid).Data1;
          (pOVar32->m_face_uuid).Data2 = uVar22;
          (pOVar32->m_face_uuid).Data3 = uVar23;
          *(undefined8 *)(pOVar32->m_face_uuid).Data4 = uVar16;
          dVar17 = (pOVar37->m_bbox).m_min.x;
          dVar18 = (pOVar37->m_bbox).m_min.y;
          dVar19 = (pOVar37->m_bbox).m_min.z;
          dVar20 = (pOVar37->m_bbox).m_max.x;
          dVar21 = (pOVar37->m_bbox).m_max.z;
          (pOVar32->m_bbox).m_max.y = (pOVar37->m_bbox).m_max.y;
          (pOVar32->m_bbox).m_max.z = dVar21;
          (pOVar32->m_bbox).m_min.z = dVar19;
          (pOVar32->m_bbox).m_max.x = dVar20;
          (pOVar32->m_bbox).m_min.x = dVar17;
          (pOVar32->m_bbox).m_min.y = dVar18;
          uVar16 = *(undefined8 *)&pOVar37->field_0xa0;
          *(undefined8 *)&pOVar32->field_0x98 = *(undefined8 *)&pOVar37->field_0x98;
          *(undefined8 *)&pOVar32->field_0xa0 = uVar16;
          uVar16 = *(undefined8 *)&pOVar37->field_0xb0;
          *(undefined8 *)&pOVar32->field_0xa8 = *(undefined8 *)&pOVar37->field_0xa8;
          *(undefined8 *)&pOVar32->field_0xb0 = uVar16;
          pOVar32->m_face_user = pOVar37->m_face_user;
          if (bVar24 != false) {
            bVar25 = ON_BoundingBox::IsValid(&pOVar32->m_bbox);
            if (bVar25) {
              ON_BoundingBox::Union(&local_90,&pOVar32->m_bbox);
            }
            else {
              ON_BoundingBox::Destroy(&local_90);
              bVar24 = false;
            }
          }
          iVar26 = (pOVar37->m_li).m_count;
          bVar25 = iVar26 < 1;
          if (0 < iVar26) {
            lVar27 = 0;
            do {
              iVar26 = (pOVar37->m_li).m_a[lVar27];
              pOVar28 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                        super_ON_ClassArray<ON_BrepLoop>.m_a;
              loop = NewLoop(local_130,pOVar28[iVar26].m_type,pOVar32);
              pOVar28 = pOVar28 + iVar26;
              ON_Object::CopyUserData((ON_Object *)loop,(ON_Object *)pOVar28);
              uVar5 = *(undefined4 *)&(pOVar28->m_pbox).m_min.x;
              uVar6 = *(undefined4 *)((long)&(pOVar28->m_pbox).m_min.x + 4);
              uVar7 = *(undefined4 *)&(pOVar28->m_pbox).m_min.y;
              uVar8 = *(undefined4 *)((long)&(pOVar28->m_pbox).m_min.y + 4);
              uVar9 = *(undefined4 *)&(pOVar28->m_pbox).m_min.z;
              uVar10 = *(undefined4 *)((long)&(pOVar28->m_pbox).m_min.z + 4);
              uVar11 = *(undefined4 *)&(pOVar28->m_pbox).m_max.x;
              uVar12 = *(undefined4 *)((long)&(pOVar28->m_pbox).m_max.x + 4);
              uVar13 = *(undefined4 *)((long)&(pOVar28->m_pbox).m_max.y + 4);
              uVar14 = *(undefined4 *)&(pOVar28->m_pbox).m_max.z;
              uVar15 = *(undefined4 *)((long)&(pOVar28->m_pbox).m_max.z + 4);
              *(undefined4 *)&(loop->m_pbox).m_max.y = *(undefined4 *)&(pOVar28->m_pbox).m_max.y;
              *(undefined4 *)((long)&(loop->m_pbox).m_max.y + 4) = uVar13;
              *(undefined4 *)&(loop->m_pbox).m_max.z = uVar14;
              *(undefined4 *)((long)&(loop->m_pbox).m_max.z + 4) = uVar15;
              *(undefined4 *)&(loop->m_pbox).m_min.z = uVar9;
              *(undefined4 *)((long)&(loop->m_pbox).m_min.z + 4) = uVar10;
              *(undefined4 *)&(loop->m_pbox).m_max.x = uVar11;
              *(undefined4 *)((long)&(loop->m_pbox).m_max.x + 4) = uVar12;
              *(undefined4 *)&(loop->m_pbox).m_min.x = uVar5;
              *(undefined4 *)((long)&(loop->m_pbox).m_min.x + 4) = uVar6;
              *(undefined4 *)&(loop->m_pbox).m_min.y = uVar7;
              *(undefined4 *)((long)&(loop->m_pbox).m_min.y + 4) = uVar8;
              loop->m_loop_user = pOVar28->m_loop_user;
              if (0 < (pOVar28->m_ti).m_count) {
                lVar41 = 0;
                do {
                  iVar26 = (pOVar28->m_ti).m_a[lVar41];
                  pOVar30 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                            super_ON_ClassArray<ON_BrepTrim>.m_a;
                  if (((__s_00[pOVar30[iVar26].m_vi[0]] < 0) ||
                      (pOVar30 = pOVar30 + iVar26, __s_00[pOVar30->m_vi[1]] < 0)) ||
                     ((-1 < (long)pOVar30->m_ei && (__s[pOVar30->m_ei] < 0)))) goto LAB_004118b3;
                  if (pOVar30->m_c2i < 0) {
                    if (pOVar30->m_type != ptonsrf) goto LAB_004118b3;
                  }
                  else {
                    iVar26 = (*(pOVar30->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                               super_ON_Object._vptr_ON_Object[0x24])(pOVar30);
                    local_b8 = (ON_Curve *)CONCAT44(extraout_var_01,iVar26);
                    if (local_b8 == (ON_Curve *)0x0) goto LAB_004118b3;
                    ON_SimpleArray<ON_Curve_*>::Append
                              (&(local_130->m_C2).super_ON_SimpleArray<ON_Curve_*>,&local_b8);
                  }
                  if ((long)pOVar30->m_ei < 0) {
                    if (pOVar30->m_type == ptonsrf) {
                      pOVar33 = NewTrim(local_130,false,loop,-1);
                      pOVar33->m_type = ptonsrf;
                      iVar26 = (local_130->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                               super_ON_ClassArray<ON_BrepVertex>.m_a[__s_00[pOVar30->m_vi[0]]].
                               m_vertex_index;
                      pOVar33->m_vi[1] = iVar26;
                      pOVar33->m_vi[0] = iVar26;
                    }
                    else {
                      if (pOVar30->m_type != singular) goto LAB_004118b3;
                      NewSingularTrim(local_130,
                                      (local_130->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                                      super_ON_ClassArray<ON_BrepVertex>.m_a +
                                      __s_00[pOVar30->m_vi[0]],loop,pOVar30->m_iso,
                                      (local_130->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count +
                                      -1);
                    }
                  }
                  else {
                    NewTrim(local_130,
                            (local_130->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                            super_ON_ClassArray<ON_BrepEdge>.m_a + __s[pOVar30->m_ei],
                            pOVar30->m_bRev3d,loop,
                            (local_130->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count + -1);
                  }
                  lVar34 = (long)(local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                 super_ON_ClassArray<ON_BrepTrim>.m_count;
                  pOVar33 = (local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                            super_ON_ClassArray<ON_BrepTrim>.m_a;
                  ON_Object::CopyUserData((ON_Object *)(pOVar33 + lVar34 + -1),(ON_Object *)pOVar30)
                  ;
                  pOVar33[lVar34 + -1].m__legacy_2d_tol = pOVar30->m__legacy_2d_tol;
                  pOVar33[lVar34 + -1].m__legacy_3d_tol = pOVar30->m__legacy_3d_tol;
                  pOVar33[lVar34 + -1].m__legacy_flags = pOVar30->m__legacy_flags;
                  pOVar33[lVar34 + -1].m_tolerance[0] = pOVar30->m_tolerance[0];
                  pOVar33[lVar34 + -1].m_tolerance[1] = pOVar30->m_tolerance[1];
                  uVar5 = *(undefined4 *)((long)&(pOVar30->m_pbox).m_min.x + 4);
                  uVar6 = *(undefined4 *)&(pOVar30->m_pbox).m_min.y;
                  uVar7 = *(undefined4 *)((long)&(pOVar30->m_pbox).m_min.y + 4);
                  uVar8 = *(undefined4 *)&(pOVar30->m_pbox).m_min.z;
                  uVar9 = *(undefined4 *)((long)&(pOVar30->m_pbox).m_min.z + 4);
                  uVar10 = *(undefined4 *)&(pOVar30->m_pbox).m_max.x;
                  uVar11 = *(undefined4 *)((long)&(pOVar30->m_pbox).m_max.x + 4);
                  uVar12 = *(undefined4 *)&(pOVar30->m_pbox).m_max.y;
                  uVar13 = *(undefined4 *)((long)&(pOVar30->m_pbox).m_max.y + 4);
                  uVar14 = *(undefined4 *)&(pOVar30->m_pbox).m_max.z;
                  uVar15 = *(undefined4 *)((long)&(pOVar30->m_pbox).m_max.z + 4);
                  *(undefined4 *)&pOVar33[lVar34 + -1].m_pbox.m_min.x =
                       *(undefined4 *)&(pOVar30->m_pbox).m_min.x;
                  *(undefined4 *)((long)&pOVar33[lVar34 + -1].m_pbox.m_min.x + 4) = uVar5;
                  *(undefined4 *)&pOVar33[lVar34 + -1].m_pbox.m_min.y = uVar6;
                  *(undefined4 *)((long)&pOVar33[lVar34 + -1].m_pbox.m_min.y + 4) = uVar7;
                  *(undefined4 *)&pOVar33[lVar34 + -1].m_pbox.m_min.z = uVar8;
                  *(undefined4 *)((long)&pOVar33[lVar34 + -1].m_pbox.m_min.z + 4) = uVar9;
                  *(undefined4 *)&pOVar33[lVar34 + -1].m_pbox.m_max.x = uVar10;
                  *(undefined4 *)((long)&pOVar33[lVar34 + -1].m_pbox.m_max.x + 4) = uVar11;
                  *(undefined4 *)&pOVar33[lVar34 + -1].m_pbox.m_max.y = uVar12;
                  *(undefined4 *)((long)&pOVar33[lVar34 + -1].m_pbox.m_max.y + 4) = uVar13;
                  *(undefined4 *)&pOVar33[lVar34 + -1].m_pbox.m_max.z = uVar14;
                  *(undefined4 *)((long)&pOVar33[lVar34 + -1].m_pbox.m_max.z + 4) = uVar15;
                  pOVar33[lVar34 + -1].m_iso = pOVar30->m_iso;
                  pOVar33[lVar34 + -1].m_trim_user = pOVar30->m_trim_user;
                  if (pOVar30->m_type != mated) {
                    pOVar33[lVar34 + -1].m_type = pOVar30->m_type;
                  }
                  lVar41 = lVar41 + 1;
                } while (lVar41 < (pOVar28->m_ti).m_count);
              }
              lVar27 = lVar27 + 1;
              lVar41 = (long)(pOVar37->m_li).m_count;
              bVar25 = lVar41 <= lVar27;
            } while (lVar27 < lVar41);
          }
        }
        if (!bVar25) {
          local_130 = (ON_Brep *)0x0;
          goto LAB_00410ea8;
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 != new_capacity);
    }
    if ((bVar24 == false) || (bVar24 = ON_BoundingBox::IsValid(&local_90), !bVar24)) {
      ON_Geometry::BoundingBox(&local_60,&local_130->super_ON_Geometry);
    }
    else {
      (local_130->m_bbox).m_max.y = local_90.m_max.y;
      (local_130->m_bbox).m_max.z = local_90.m_max.z;
      (local_130->m_bbox).m_min.z = local_90.m_min.z;
      (local_130->m_bbox).m_max.x = local_90.m_max.x;
      (local_130->m_bbox).m_min.x = local_90.m_min.x;
      (local_130->m_bbox).m_min.y = local_90.m_min.y;
    }
    local_b0.m_p = (ON_Brep *)0x0;
    local_b0.m_sub_brep = (ON_Brep *)0x0;
  }
LAB_00410ea8:
  SubBrep::LeakStopper::~LeakStopper(&local_b0);
  return local_130;
}

Assistant:

ON_Brep* ON_Brep::SubBrep( 
          int subfi_count, 
          const int* subfi, 
          ON_Brep* sub_brep
          ) const
{
  class LeakStopper : public ON_Workspace
  {
    // If an error occures during construction,
    // this class cleans up sub_brep in an
    // appropriate fashion.
  public:
    LeakStopper() {m_p=0;m_sub_brep=0;}
    ~LeakStopper() {if (m_p) delete m_p; else if (m_sub_brep) m_sub_brep->Destroy();}
    ON_Brep* m_p;        // ON_Brep::SubBrep allocated sub_brep
    ON_Brep* m_sub_brep; // user's sub_brep argument
  };
  LeakStopper leak_stopper;

  if ( sub_brep )
    sub_brep->Destroy();

  if ( subfi_count <= 0 || 0 == subfi )
    return 0;

  if ( subfi_count > m_F.Count() )
    return 0;

  // validate indices in extract_fi[] and
  // make sure there are no duplicates.
  int fi, fli, lti, i, j;
  int Lcount = 0;
  int Tcount = 0;
  int Ecount = 0;
  int Vcount = 0;
  int maxfi = -1;
  int minfi = m_F.Count();
  int* Emap = leak_stopper.GetIntMemory(m_E.Count());
  memset(Emap,0,m_E.Count()*sizeof(Emap[0]));
  int* Vmap = leak_stopper.GetIntMemory(m_V.Count());
  memset(Vmap,0,m_V.Count()*sizeof(Vmap[0]));
  for ( i = 0; i < subfi_count; i++ )
  {
    fi = subfi[i];
    if ( fi < 0 || fi >= m_F.Count() )
    {
      ON_ERROR("ON_Brep::SubBrep sub_fi[] has invalid indices");
      return 0;
    }
    if ( fi > maxfi )
      maxfi = fi;
    else if ( fi < minfi )
      minfi = fi;
    else
    {
      for ( j = 0; j < i; j++ )
      {
        if ( subfi[j] == fi )
        {
          ON_ERROR("ON_Brep::SubBrep sub_fi[] has duplicate indices");
          return 0;
        }
      }
    }

    const ON_BrepFace& face = m_F[fi];
    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = face.Loop(fli);
      if ( !loop || this != loop->Brep() )
        return 0;
      Lcount++;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = loop->Trim(lti);
        if ( !trim || this != trim->Brep() )
          return 0;
        Tcount++;
        if ( trim->m_vi[0] < 0 || trim->m_vi[0] >= m_V.Count() )
          return 0;
        if ( trim->m_vi[1] < 0 || trim->m_vi[1] >= m_V.Count() )
          return 0;
        if ( 0 == Vmap[trim->m_vi[0]] )
        {
          Vmap[trim->m_vi[0]] = 1;
          Vcount++;
        }
        if ( 0 == Vmap[trim->m_vi[1]] )
        {
          Vmap[trim->m_vi[1]] = 1;
          Vcount++;
        }
        if ( ON_BrepTrim::singular == trim->m_type ||
             ON_BrepTrim::ptonsrf == trim->m_type)   // March 29, 2010 Lowell - Allow ptonsrf
        {
          if ( trim->m_ei >= 0 || trim->m_vi[0] != trim->m_vi[1] )
            return 0;
        }
        else if ( trim->m_ei >= 0 )
        {
          const ON_BrepEdge* edge = trim->Edge();
          if ( 0 == edge || this != edge->Brep() )
            return 0;
          if ( 0 == Emap[trim->m_ei] )
          {
            Emap[trim->m_ei] = 1;
            Ecount++;
            // edge's vertices should already be mapped.
            if ( 0 == Vmap[edge->m_vi[0]] )
              return 0;
            if ( 0 == Vmap[edge->m_vi[1]] )
              return 0;
          }          
        }
        else
        {
          return 0;
        }
      }
    }
  }

  if ( !sub_brep )
  {
    sub_brep = ON_Brep::New();
    leak_stopper.m_p = sub_brep;
  }
  else
  {
    leak_stopper.m_sub_brep = sub_brep;
  }

  sub_brep->m_F.Reserve(subfi_count);
  sub_brep->m_L.Reserve(Lcount);
  sub_brep->m_T.Reserve(Tcount);
  sub_brep->m_E.Reserve(Ecount);
  sub_brep->m_V.Reserve(Vcount);
  sub_brep->m_S.Reserve(subfi_count);
  sub_brep->m_C2.Reserve(Tcount);
  sub_brep->m_C3.Reserve(Ecount);

  // build sub_brep vertices
  for ( i = 0; i < m_V.Count(); i++ )
  {
    if ( Vmap[i] )
    {
      const ON_BrepVertex& vertex = m_V[i];
      ON_BrepVertex& sub_vertex = sub_brep->NewVertex(vertex.point,vertex.m_tolerance);
      Vmap[i] = sub_vertex.m_vertex_index;
      sub_vertex.CopyUserData(vertex);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_vertex.m_vertex_user, &vertex.m_vertex_user, sizeof(sub_vertex.m_vertex_user));
    }
    else
      Vmap[i] = -1;
  }

  // build sub_brep edges
  for ( i = 0; i < m_E.Count(); i++ )
  {
    if ( Emap[i] )
    {
      const ON_BrepEdge& edge = m_E[i];
      if ( Vmap[edge.m_vi[0]] < 0 )
        return 0;
      if ( Vmap[edge.m_vi[1]] < 0 )
        return 0;
      ON_Curve* c3 = edge.DuplicateCurve();
      if ( 0 == c3 )
        return 0;
      sub_brep->m_C3.Append(c3);
      ON_BrepVertex& sub_v0 = sub_brep->m_V[Vmap[edge.m_vi[0]]];
      ON_BrepVertex& sub_v1 = sub_brep->m_V[Vmap[edge.m_vi[1]]];
      ON_BrepEdge& sub_edge = sub_brep->NewEdge(sub_v0,sub_v1,sub_brep->m_C3.Count()-1,0,edge.m_tolerance);
      Emap[i] = sub_edge.m_edge_index;
      sub_edge.CopyUserData(edge);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_edge.m_edge_user, &edge.m_edge_user, sizeof(sub_edge.m_edge_user));
    }
    else
      Emap[i] = -1;
  }

  bool bHaveBBox = m_bbox.IsValid();
  ON_BoundingBox sub_bbox;

  for ( i = 0; i < subfi_count; i++ )
  {
    const ON_BrepFace& face = m_F[subfi[i]];
    ON_Surface* srf = face.DuplicateSurface();
    if (!srf)
      return 0;
    sub_brep->m_S.Append(srf);
    ON_BrepFace& sub_face = sub_brep->NewFace(sub_brep->m_S.Count()-1);
    sub_face.CopyUserData(face);
    sub_face.m_bRev = face.m_bRev;
    sub_face.m_face_material_channel = face.m_face_material_channel;
    sub_face.m_face_uuid = face.m_face_uuid;
    sub_face.m_bbox = face.m_bbox;
    sub_face.m_domain[0] = face.m_domain[0];
    sub_face.m_domain[1] = face.m_domain[1];
    // March 29, 2010 Lowell - Copy user fields
    memcpy(&sub_face.m_face_user, &face.m_face_user, sizeof(sub_face.m_face_user));

    if ( bHaveBBox )
    {
      if ( sub_face.m_bbox.IsValid() )
        sub_bbox.Union(sub_face.m_bbox);
      else
      {
        bHaveBBox = false;
        sub_bbox.Destroy();
      }
    }


    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop& loop = m_L[face.m_li[fli]];
      ON_BrepLoop& sub_loop = sub_brep->NewLoop(loop.m_type,sub_face);
      sub_loop.CopyUserData(loop);
      sub_loop.m_pbox = loop.m_pbox;
      // April 19, 2010 Lowell - Copy user fields
      memcpy(&sub_loop.m_loop_user, &loop.m_loop_user, sizeof(sub_loop.m_loop_user));

      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        const ON_BrepTrim& trim = m_T[loop.m_ti[lti]];
        if ( Vmap[trim.m_vi[0]] < 0 || Vmap[trim.m_vi[1]] < 0 )
          return 0;
        if ( trim.m_ei >= 0 && Emap[trim.m_ei] < 0 )
          return 0;
        if(trim.m_c2i >= 0)
        {
          ON_Curve* c2 = trim.DuplicateCurve();
          if ( !c2 )
            return 0;
          sub_brep->m_C2.Append(c2);
        }
        else if(trim.m_type != ON_BrepTrim::ptonsrf)
          return 0;
        if ( trim.m_ei >= 0 )
        {
          ON_BrepEdge& sub_edge = sub_brep->m_E[Emap[trim.m_ei]];
          sub_brep->NewTrim(sub_edge,trim.m_bRev3d,sub_loop,sub_brep->m_C2.Count()-1);
        }
        else if ( ON_BrepTrim::singular == trim.m_type )
        {
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_brep->NewSingularTrim(sub_vertex,sub_loop,trim.m_iso,sub_brep->m_C2.Count()-1);
        }
        // March 29, 2010 Lowell - copy ptonsrf type
        else if ( ON_BrepTrim::ptonsrf == trim.m_type)
        {
          ON_BrepTrim& sub_trim = sub_brep->NewTrim(false, sub_loop, -1);
          sub_trim.m_type = ON_BrepTrim::ptonsrf;
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_trim.m_vi[0] = sub_trim.m_vi[1] = sub_vertex.m_vertex_index;
        }
        else
        {
          return 0;
        }
        ON_BrepTrim& sub_trim = sub_brep->m_T[sub_brep->m_T.Count()-1];
        sub_trim.CopyUserData(trim);
        sub_trim.m__legacy_2d_tol = trim.m__legacy_2d_tol;
        sub_trim.m__legacy_3d_tol = trim.m__legacy_3d_tol;
        sub_trim.m__legacy_flags = trim.m__legacy_flags;
        sub_trim.m_tolerance[0] = trim.m_tolerance[0];
        sub_trim.m_tolerance[1] = trim.m_tolerance[1];
        sub_trim.m_pbox = trim.m_pbox;
        sub_trim.m_iso = trim.m_iso;
        // April 19, 2010 Lowell - Copy user fields
        memcpy(&sub_trim.m_trim_user, &trim.m_trim_user, sizeof(sub_trim.m_trim_user));

        // Since we are extracting a subset of the original brep,
        // some mated edges could turn into boundary edges. The
        // call to NewTrim() above will correctly handle setting
        // and updating sub_trims that came from mated trims.
        if ( ON_BrepTrim::mated != trim.m_type )
          sub_trim.m_type = trim.m_type;
      }
    }
  }

  if ( !bHaveBBox || !sub_bbox.IsValid() )
    sub_brep->BoundingBox();
  else
    sub_brep->m_bbox = sub_bbox;

  // return subbrep after disabling the leak stopper
  leak_stopper.m_p = 0;
  leak_stopper.m_sub_brep = 0;
  return sub_brep;
}